

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status
fdb_set_log_callback_ex
          (fdb_file_handle *fhandle,fdb_kvs_handle *handle,fdb_log_callback_ex log_callback,
          void *ctx_data)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  
  fVar2 = FDB_RESULT_INVALID_HANDLE;
  if (handle != (fdb_kvs_handle *)0x0 && fhandle != (fdb_file_handle *)0x0) {
    pfVar1 = fhandle->root;
    (pfVar1->log_callback).callback_ex = log_callback;
    (pfVar1->log_callback).ctx_data = ctx_data;
    (handle->log_callback).callback_ex = log_callback;
    (handle->log_callback).ctx_data = ctx_data;
    fVar2 = FDB_RESULT_SUCCESS;
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_log_callback_ex(fdb_file_handle* fhandle,
                                   fdb_kvs_handle* handle,
                                   fdb_log_callback_ex log_callback,
                                   void* ctx_data)
{
    if (!fhandle || !handle) return FDB_RESULT_INVALID_HANDLE;

    fhandle->root->log_callback.callback_ex = log_callback;
    fhandle->root->log_callback.ctx_data = ctx_data;

    handle->log_callback.callback_ex = log_callback;
    handle->log_callback.ctx_data = ctx_data;
    return FDB_RESULT_SUCCESS;
}